

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

double xc_cheb_eval(double x,double *cs,int N)

{
  double dVar1;
  double b2;
  double b1;
  double b0;
  double twox;
  int i;
  int N_local;
  double *cs_local;
  double x_local;
  
  b0 = 0.0;
  b1 = 0.0;
  b2 = 0.0;
  for (i = N + -1; -1 < i; i = i + -1) {
    b2 = b1;
    dVar1 = b0;
    b0 = x * 2.0 * b0 + -b1 + cs[i];
    b1 = dVar1;
  }
  return (b0 - b2) * 0.5;
}

Assistant:

GPU_FUNCTION
static inline double
xc_cheb_eval(const double x, const double *cs, const int N)
{
  int i;
  double twox, b0, b1, b2;

  b2 = b1 = b0 = 0.0;

  twox = 2.0*x;
  for(i=N-1; i>=0; i--){
    b2 = b1;
    b1 = b0;
    b0 = twox*b1 - b2 + cs[i];
  }

  return 0.5*(b0 - b2);
}